

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall
ast::GreaterThanOrEqual::GreaterThanOrEqual(GreaterThanOrEqual *this,Token *t,int line)

{
  Token TStack_48;
  
  token::Token::Token(&TStack_48,t);
  BinaryOp::BinaryOp(&this->super_BinaryOp,&TStack_48,1,0,line);
  token::Token::~Token(&TStack_48);
  (this->super_BinaryOp).super_Op.super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR__BinaryOp_00122458;
  return;
}

Assistant:

GreaterThanOrEqual(Token t, int line)
        :BinaryOp(t, PRECENDENCE::GT_EQ, ASSOCIATION::LEFT, line){}